

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall
Js::CompoundString::Block::Block
          (Block *this,void *buffer,CharCount charLength,CharCount charCapacity)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  Type *pTVar6;
  ulong sizeInWords;
  char16 *src;
  nullptr_t local_28;
  CharCount local_20;
  CharCount local_1c;
  CharCount charCapacity_local;
  CharCount charLength_local;
  void *buffer_local;
  Block *this_local;
  
  local_20 = charCapacity;
  local_1c = charLength;
  _charCapacity_local = buffer;
  buffer_local = this;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierPtr(&this->bufferOwner,this);
  this->charLength = local_1c;
  this->charCapacity = local_20;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_Js::CompoundString::Block>::WriteBarrierPtr
            (&this->previous,&local_28);
  if (_charCapacity_local == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x25,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_20 < local_1c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x26,"(charLength <= charCapacity)","charLength <= charCapacity");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pcVar5 = Chars(this);
  pTVar6 = Pointers(pcVar5);
  CVar3 = PointerLengthFromCharLength(local_1c);
  Memory::
  ArrayWriteBarrierVerifyBits<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            (pTVar6,(ulong)CVar3);
  pcVar5 = Chars(this);
  sizeInWords = (ulong)local_1c;
  src = Chars(_charCapacity_local);
  js_wmemcpy_s(pcVar5,sizeInWords,src,(ulong)local_1c);
  pTVar6 = Pointers(this);
  CVar3 = PointerLengthFromCharLength(local_1c);
  Memory::
  ArrayWriteBarrier<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            (pTVar6,(ulong)CVar3);
  return;
}

Assistant:

CompoundString::Block::Block(
        const void *const buffer,
        const CharCount charLength,
        const CharCount charCapacity)
        : bufferOwner(this), charLength(charLength), charCapacity(charCapacity), previous(nullptr)
    {
        Assert(buffer);
        Assert(charLength <= charCapacity);

        ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charLength));
        js_wmemcpy_s(Chars(), charLength, Chars(buffer), charLength);
        // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
        ArrayWriteBarrier(Pointers(), PointerLengthFromCharLength(charLength));
    }